

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

int GCPtr<symbols::FunctionObject>::shutdown(int __fd,int __how)

{
  int in_EAX;
  list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_> *plVar1;
  int iVar2;
  
  if ((int)gclist_abi_cxx11_.
           super__List_base<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
           ._M_impl._M_node._M_size == 0) {
    return in_EAX;
  }
  plVar1 = &gclist_abi_cxx11_;
  while (plVar1 = (list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
                   *)(plVar1->
                     super__List_base<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next, plVar1 != &gclist_abi_cxx11_)
  {
    *(undefined4 *)((long)plVar1 + 0x10) = 0;
  }
  iVar2 = 0;
  do {
    plVar1 = &gclist_abi_cxx11_;
    do {
      plVar1 = (list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
                *)(plVar1->
                  super__List_base<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
      if (plVar1 == &gclist_abi_cxx11_) {
        return iVar2;
      }
    } while (*(int *)((long)plVar1 + 0x10) != 0);
    std::__cxx11::
    list<GCInfo<symbols::FunctionObject>,_std::allocator<GCInfo<symbols::FunctionObject>_>_>::remove
              (&gclist_abi_cxx11_,(char *)((long)plVar1 + 0x10));
    iVar2 = 1;
    if (*(_List_node_base **)((long)plVar1 + 0x10U + 8) != (_List_node_base *)0x0) {
      (**(code **)((long)(*(_List_node_base **)((long)plVar1 + 0x10U + 8))->_M_next + 0x10))();
    }
  } while( true );
}

Assistant:

void GCPtr<T>::shutdown() {
    if(gclistSize() == 0) return ; // list is empty

    typename list<GCInfo<T>>::iterator p;

    for(p = gclist.begin(); p != gclist.end(); p++){
        // Set all reference counts to zero
        p->refcount = 0;
    }
    #ifdef DISPLAY
    cout << "Before collecting for shutdown() for "
    << typeid(T).name() << "\n";
    #endif

    collect();

    #ifdef DISPLAY
    cout << "After collecting for shutdown() for "
    << typeid(T).name() << "\n";
    #endif


}